

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  uv_loop_t *loop;
  char *pcVar4;
  uv_timer_t *puVar5;
  undefined8 uStack_750;
  uv_timer_t never;
  uv_timer_t repeat;
  uv_timer_t once_timers [10];
  
  uVar2 = uv_default_loop();
  start_time = uv_now(uVar2);
  if (start_time == 0) {
    pcVar4 = "0 < start_time";
    uStack_750 = 0x62;
  }
  else {
    puVar5 = once_timers;
    lVar3 = 0;
    do {
      if (lVar3 + 0x32 == 0x226) {
        uVar2 = uv_default_loop();
        iVar1 = uv_timer_init(uVar2,&repeat);
        if (iVar1 == 0) {
          iVar1 = uv_timer_start(&repeat,repeat_cb,100);
          if (iVar1 == 0) {
            uVar2 = uv_default_loop();
            iVar1 = uv_timer_init(uVar2,&never);
            if (iVar1 == 0) {
              iVar1 = uv_timer_start(&never,never_cb,100);
              if (iVar1 == 0) {
                iVar1 = uv_timer_stop(&never);
                if (iVar1 == 0) {
                  uv_unref(&never);
                  uVar2 = uv_default_loop();
                  uv_run(uVar2,0);
                  if (once_cb_called == 10) {
                    if (once_close_cb_called == 10) {
                      printf("repeat_cb_called %d\n",(ulong)(uint)repeat_cb_called);
                      if (repeat_cb_called == 5) {
                        if (repeat_close_cb_called == 1) {
                          uVar2 = uv_default_loop();
                          lVar3 = uv_now(uVar2);
                          if (lVar3 - start_time < 500) {
                            pcVar4 = "500 <= uv_now(uv_default_loop()) - start_time";
                            uStack_750 = 0x84;
                          }
                          else {
                            loop = (uv_loop_t *)uv_default_loop();
                            close_loop(loop);
                            uVar2 = uv_default_loop();
                            iVar1 = uv_loop_close(uVar2);
                            if (iVar1 == 0) {
                              return 0;
                            }
                            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                            uStack_750 = 0x86;
                          }
                        }
                        else {
                          pcVar4 = "repeat_close_cb_called == 1";
                          uStack_750 = 0x82;
                        }
                      }
                      else {
                        pcVar4 = "repeat_cb_called == 5";
                        uStack_750 = 0x81;
                      }
                    }
                    else {
                      pcVar4 = "once_close_cb_called == 10";
                      uStack_750 = 0x7f;
                    }
                  }
                  else {
                    pcVar4 = "once_cb_called == 10";
                    uStack_750 = 0x7e;
                  }
                }
                else {
                  pcVar4 = "r == 0";
                  uStack_750 = 0x79;
                }
              }
              else {
                pcVar4 = "r == 0";
                uStack_750 = 0x77;
              }
            }
            else {
              pcVar4 = "r == 0";
              uStack_750 = 0x75;
            }
          }
          else {
            pcVar4 = "r == 0";
            uStack_750 = 0x71;
          }
        }
        else {
          pcVar4 = "r == 0";
          uStack_750 = 0x6f;
        }
        goto LAB_0015fe25;
      }
      uVar2 = uv_default_loop();
      iVar1 = uv_timer_init(uVar2,puVar5);
      if (iVar1 != 0) {
        pcVar4 = "r == 0";
        uStack_750 = 0x68;
        goto LAB_0015fe25;
      }
      iVar1 = uv_timer_start(puVar5,once_cb,lVar3,0);
      puVar5 = puVar5 + 1;
      lVar3 = lVar3 + 0x32;
    } while (iVar1 == 0);
    pcVar4 = "r == 0";
    uStack_750 = 0x6a;
  }
LAB_0015fe25:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
          ,uStack_750,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(timer) {
  uv_timer_t once_timers[10];
  uv_timer_t *once;
  uv_timer_t repeat, never;
  unsigned int i;
  int r;

  start_time = uv_now(uv_default_loop());
  ASSERT(0 < start_time);

  /* Let 10 timers time out in 500 ms total. */
  for (i = 0; i < ARRAY_SIZE(once_timers); i++) {
    once = once_timers + i;
    r = uv_timer_init(uv_default_loop(), once);
    ASSERT(r == 0);
    r = uv_timer_start(once, once_cb, i * 50, 0);
    ASSERT(r == 0);
  }

  /* The 11th timer is a repeating timer that runs 4 times */
  r = uv_timer_init(uv_default_loop(), &repeat);
  ASSERT(r == 0);
  r = uv_timer_start(&repeat, repeat_cb, 100, 100);
  ASSERT(r == 0);

  /* The 12th timer should not do anything. */
  r = uv_timer_init(uv_default_loop(), &never);
  ASSERT(r == 0);
  r = uv_timer_start(&never, never_cb, 100, 100);
  ASSERT(r == 0);
  r = uv_timer_stop(&never);
  ASSERT(r == 0);
  uv_unref((uv_handle_t*)&never);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(once_cb_called == 10);
  ASSERT(once_close_cb_called == 10);
  printf("repeat_cb_called %d\n", repeat_cb_called);
  ASSERT(repeat_cb_called == 5);
  ASSERT(repeat_close_cb_called == 1);

  ASSERT(500 <= uv_now(uv_default_loop()) - start_time);

  MAKE_VALGRIND_HAPPY();
  return 0;
}